

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QString * QSysInfo::productType(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QUnixOSVersion local_58;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.prettyName.d.d = (Data *)0x0;
  local_58.prettyName.d.ptr = (char16_t *)0x0;
  local_58.productVersion.d.ptr = (char16_t *)0x0;
  local_58.productVersion.d.size = 0;
  local_58.productType.d.size = 0;
  local_58.productVersion.d.d = (Data *)0x0;
  local_58.productType.d.d = (Data *)0x0;
  local_58.productType.d.ptr = (char16_t *)0x0;
  local_58.prettyName.d.size = 0;
  findUnixOsVersion(&local_58);
  if (local_58.productType.d.size == 0) {
    unknownText();
  }
  else {
    (in_RDI->d).d = local_58.productType.d.d;
    (in_RDI->d).ptr = local_58.productType.d.ptr;
    (in_RDI->d).size = local_58.productType.d.size;
    if (local_58.productType.d.d != (Data *)0x0) {
      LOCK();
      ((local_58.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
  }
  QUnixOSVersion::~QUnixOSVersion(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::productType()
{
    // similar, but not identical to QFileSelectorPrivate::platformSelectors
#if defined(Q_OS_WIN)
    return QStringLiteral("windows");

#elif defined(Q_OS_QNX)
    return QStringLiteral("qnx");

#elif defined(Q_OS_ANDROID)
    return QStringLiteral("android");

#elif defined(Q_OS_IOS)
    return QStringLiteral("ios");
#elif defined(Q_OS_TVOS)
    return QStringLiteral("tvos");
#elif defined(Q_OS_WATCHOS)
    return QStringLiteral("watchos");
#elif defined(Q_OS_VISIONOS)
    return QStringLiteral("visionos");
#elif defined(Q_OS_MACOS)
    return QStringLiteral("macos");
#elif defined(Q_OS_DARWIN)
    return QStringLiteral("darwin");
#elif defined(Q_OS_WASM)
    return QStringLiteral("wasm");
#elif defined(Q_OS_VXWORKS)
    return QStringLiteral("vxworks");

#elif defined(USE_ETC_OS_RELEASE) // Q_OS_UNIX
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.productType.isEmpty())
        return unixOsVersion.productType;
#endif
    return unknownText();
}